

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O2

void clean_mud(void)

{
  bool bVar1;
  int iVar2;
  DESCRIPTOR_DATA *pDVar3;
  CRow *pCVar4;
  char *pcVar5;
  CHAR_DATA *ch;
  string_view fmt;
  string_view fmt_00;
  CRow row;
  DbConnection riftCore;
  CSQLInterface nSQL;
  char buf [4608];
  char tbuf [4608];
  
  CSQLInterface::CSQLInterface(&nSQL);
  Config::GetDbConnection(&riftCore,&nSQL.Settings,"rift");
  bVar1 = CSQLInterface::StartSQLServer
                    (&nSQL,riftCore.Host._M_dataplus._M_p,riftCore.Db._M_dataplus._M_p,
                     riftCore.User._M_dataplus._M_p,riftCore.Pwd._M_dataplus._M_p);
  if (bVar1) {
    sprintf(buf,"DELETE FROM logins WHERE ctime + 5184000 < %ld",current_time);
    one_query(buf);
    sprintf(buf,"DELETE FROM notes WHERE timestamp + 2592000 < %ld",current_time);
    one_query(buf);
    sprintf(buf,"DELETE FROM offerings WHERE time + 2592000 < %ld",current_time);
    one_query(buf);
    sprintf(buf,"DELETE FROM pklogs WHERE ctime + 5184000 < %ld",current_time);
    one_query(buf);
    iVar2 = CSQLInterface::Select
                      (&RS.SQL,"name FROM players WHERE lastlogin + 2592000 < %ld",current_time);
    if (iVar2 != 0) {
      pDVar3 = new_descriptor();
      while( true ) {
        bVar1 = CSQLInterface::End(&RS.SQL);
        if (bVar1) break;
        pCVar4 = CSQLInterface::GetRow(&RS.SQL);
        row.maxcol = pCVar4->maxcol;
        row.maxrow = pCVar4->maxrow;
        row.rowpos = pCVar4->rowpos;
        row.row = pCVar4->row;
        pcVar5 = CRow::operator[](&row,0);
        strcpy(tbuf,pcVar5);
        bVar1 = load_char_obj(pDVar3,tbuf);
        ch = pDVar3->character;
        if (bVar1) {
          ch->desc = (DESCRIPTOR_DATA *)0x0;
          if (0x1d < ch->level) {
            perm_death_log(ch,4);
            ch = pDVar3->character;
          }
          delete_char(ch->true_name,true);
        }
        else {
          free_char(ch);
        }
      }
      free_descriptor(pDVar3);
    }
    iVar2 = CSQLInterface::Select(&RS.SQL,"name FROM players");
    if (iVar2 != 0) {
      pDVar3 = new_descriptor();
      while( true ) {
        bVar1 = CSQLInterface::End(&RS.SQL);
        if (bVar1) break;
        pCVar4 = CSQLInterface::GetRow(&RS.SQL);
        row.maxcol = pCVar4->maxcol;
        row.maxrow = pCVar4->maxrow;
        row.rowpos = pCVar4->rowpos;
        row.row = pCVar4->row;
        pcVar5 = CRow::operator[](&row,0);
        strcpy(tbuf,pcVar5);
        bVar1 = load_char_obj(pDVar3,tbuf);
        if (!bVar1) {
          pcVar5 = CRow::operator[](&row,0);
          CSQLInterface::Delete(&nSQL,"players WHERE name = \'%s\'",pcVar5);
          fmt_00._M_str = "Deleting player...";
          fmt_00._M_len = 0x12;
          CLogger::Info<>((CLogger *)&RS.field_0x140,fmt_00);
        }
        free_char(pDVar3->character);
      }
      free_descriptor(pDVar3);
    }
  }
  else {
    fmt._M_str = "clean_mud: failed to establish a database connection.";
    fmt._M_len = 0x35;
    CLogger::Error<>((CLogger *)&RS.field_0x140,fmt);
  }
  DbConnection::~DbConnection(&riftCore);
  CSQLInterface::~CSQLInterface(&nSQL);
  return;
}

Assistant:

void clean_mud()
{
	char buf[MSL], tbuf[MSL];
	int cres = 0;
	CRow row;
	CSQLInterface nSQL;
	DESCRIPTOR_DATA *d;

	DbConnection riftCore = nSQL.Settings.GetDbConnection("rift");
	if (!nSQL.StartSQLServer(riftCore.Host.c_str(),
		riftCore.Db.c_str(), riftCore.User.c_str(), riftCore.Pwd.c_str()))
	{
		RS.Logger.Error("clean_mud: failed to establish a database connection.");
		return;
	}

	// 5184000 = one month

	sprintf(buf, "DELETE FROM logins WHERE ctime + 5184000 < %ld", current_time);
	one_query(buf);

	sprintf(buf, "DELETE FROM notes WHERE timestamp + 2592000 < %ld", current_time);
	one_query(buf);

	sprintf(buf, "DELETE FROM offerings WHERE time + 2592000 < %ld", current_time);
	one_query(buf);

	sprintf(buf, "DELETE FROM pklogs WHERE ctime + 5184000 < %ld", current_time);
	one_query(buf);

	// autodelete...
	cres = RS.SQL.Select("name FROM players WHERE lastlogin + 2592000 < %ld", current_time);

	if (cres)
	{
		d = new_descriptor();

		while (!RS.SQL.End())
		{
			row = RS.SQL.GetRow();
			strcpy(&tbuf[0], row[0]);

			if (!load_char_obj(d, tbuf))
			{
				free_char(d->character);
				continue;
			}

			d->character->desc = nullptr;

			if (d->character->level >= 30)
				perm_death_log(d->character, 4);

			delete_char(d->character->true_name, true);
		}

		free_descriptor(d);
	}

	// compare db to pfiles
	cres = RS.SQL.Select("name FROM players");

	if (cres)
	{
		d = new_descriptor();

		while (!RS.SQL.End())
		{
			row = RS.SQL.GetRow();
			strcpy(&tbuf[0], row[0]);

			if (!load_char_obj(d, tbuf))
			{
				nSQL.Delete("players WHERE name = '%s'", row[0]);
				RS.Logger.Info("Deleting player...");
			}

			free_char(d->character);
		}

		free_descriptor(d);
	}
}